

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

void __thiscall HEkk::putBacktrackingBasis(HEkk *this)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  HighsInt i;
  long lVar5;
  
  HighsSimplexAnalysis::simplexTimerStart(&this->analysis_,0x1c,0);
  iVar1 = (this->lp_).num_row_;
  piVar2 = (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->scattered_dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (lVar5 = 0; lVar5 < iVar1; lVar5 = lVar5 + 1) {
    pdVar4[piVar2[lVar5]] = pdVar3[lVar5];
  }
  HighsSimplexAnalysis::simplexTimerStop(&this->analysis_,0x1c,0);
  putBacktrackingBasis(this,&(this->basis_).basicIndex_);
  return;
}

Assistant:

void HEkk::putBacktrackingBasis() {
  const vector<HighsInt>& basicIndex = basis_.basicIndex_;
  analysis_.simplexTimerStart(PermWtClock);
  for (HighsInt i = 0; i < lp_.num_row_; i++)
    scattered_dual_edge_weight_[basicIndex[i]] = dual_edge_weight_[i];
  analysis_.simplexTimerStop(PermWtClock);
  putBacktrackingBasis(basicIndex);
}